

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

vm_obj_id_t CVmObjList::intersect(vm_val_t *l1,vm_val_t *l2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  vm_val_t *this;
  CVmObjPageEntry *this_00;
  uint16_t tmp;
  size_t idx;
  vm_val_t curval;
  
  iVar1 = vm_val_t::ll_length(l1);
  iVar2 = vm_val_t::ll_length(l2);
  iVar3 = iVar2;
  if (iVar1 < iVar2) {
    iVar3 = iVar1;
  }
  this = l1;
  if (iVar2 < iVar1) {
    this = l2;
    l2 = l1;
  }
  idx = 0;
  vVar4 = create(0,(long)iVar3);
  this_00 = G_obj_table_X.pages_[vVar4 >> 0xc] + (vVar4 & 0xfff);
  cons_clear((CVmObjList *)this_00);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (iVar1 = 1; iVar1 - iVar3 != 1; iVar1 = iVar1 + 1) {
    vm_val_t::ll_index(this,&curval,iVar1);
    iVar2 = find_in_list(l2,&curval,(size_t *)0x0);
    if (iVar2 != 0) {
      cons_set_element((CVmObjList *)this_00,idx,&curval);
      idx = idx + 1;
    }
  }
  **(undefined2 **)((long)&this_00->ptr_ + 8) = (short)idx;
  return vVar4;
}

Assistant:

vm_obj_id_t CVmObjList::intersect(VMG_ const vm_val_t *l1,
                                  const vm_val_t *l2)
{
    int cnt1;
    int cnt2;
    int idx;
    vm_obj_id_t resobj;
    CVmObjList *reslst;
    size_t residx;

    /* get the lengths of the lists */
    cnt1 = l1->ll_length(vmg0_);
    cnt2 = l2->ll_length(vmg0_);

    /* if the first list is larger than the second, swap them */
    if (cnt1 > cnt2)
    {
        /* swap the vm_val_t pointers */
        const vm_val_t *tmp = l1;
        l1 = l2;
        l2 = tmp;

        /* forget the larger count; just copy the smaller list */
        cnt1 = cnt2;
    }

    /* 
     *   Allocate our result list.  The result list can't have any more
     *   elements in it than the shorter of the two lists, whose length is
     *   now in cnt1. 
     */
    resobj = create(vmg_ FALSE, cnt1);
    reslst = (CVmObjList *)vm_objp(vmg_ resobj);
    reslst->cons_clear();

    /* we haven't put any elements in the result list yet */
    residx = 0;

    /* 
     *   for each element in the first list, find the element in the
     *   second list 
     */
    for (idx = 1 ; idx <= cnt1 ; ++idx)
    {
        vm_val_t curval;
        
        /* get this element from the first list */
        l1->ll_index(vmg_ &curval, idx);
        
        /* find the element in the second list */
        if (find_in_list(vmg_ l2, &curval, 0))
        {
            /* we found it - copy it into the result list */
            reslst->cons_set_element(residx, &curval);

            /* count the new entry in the result list */
            ++residx;
        }
    }

    /* 
     *   set the actual result length, which might be shorter than the
     *   amount we allocated 
     */
    reslst->cons_set_len(residx);

    /* return the result list */
    return resobj;
}